

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::End(void)

{
  int iVar1;
  ImGuiContext *pIVar2;
  ImGuiContext *pIVar3;
  ImGuiContext *g;
  int iVar4;
  ImGuiWindow *pIVar5;
  float fVar6;
  
  pIVar2 = GImGui;
  pIVar5 = GImGui->CurrentWindow;
  if ((1 < (GImGui->CurrentWindowStack).Size) ||
     (GImGui->WithinFrameScopeWithImplicitWindow == false)) {
    if ((pIVar5->DC).CurrentColumns != (ImGuiOldColumns *)0x0) {
      EndColumns();
    }
    PopClipRect();
    if ((pIVar5->Flags & 0x1000000) == 0) {
      LogFinish();
    }
    iVar1 = (pIVar2->CurrentWindowStack).Size;
    iVar4 = iVar1 + -1;
    (pIVar2->CurrentWindowStack).Size = iVar4;
    if ((pIVar5->Flags & 0x4000000) != 0) {
      (pIVar2->BeginPopupStack).Size = (pIVar2->BeginPopupStack).Size + -1;
    }
    pIVar3 = GImGui;
    if (iVar4 == 0) {
      pIVar5 = (ImGuiWindow *)0x0;
    }
    else {
      pIVar5 = (pIVar2->CurrentWindowStack).Data[(long)iVar1 + -2];
    }
    GImGui->CurrentWindow = pIVar5;
    if (pIVar5 != (ImGuiWindow *)0x0) {
      fVar6 = pIVar3->FontBaseSize * pIVar5->FontWindowScale;
      if (pIVar5->ParentWindow != (ImGuiWindow *)0x0) {
        fVar6 = fVar6 * pIVar5->ParentWindow->FontWindowScale;
      }
      (pIVar3->DrawListSharedData).FontSize = fVar6;
      pIVar3->FontSize = fVar6;
    }
  }
  return;
}

Assistant:

void ImGui::End()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    // Error checking: verify that user hasn't called End() too many times!
    if (g.CurrentWindowStack.Size <= 1 && g.WithinFrameScopeWithImplicitWindow)
    {
        IM_ASSERT_USER_ERROR(g.CurrentWindowStack.Size > 1, "Calling End() too many times!");
        return;
    }
    IM_ASSERT(g.CurrentWindowStack.Size > 0);

    // Error checking: verify that user doesn't directly call End() on a child window.
    if (window->Flags & ImGuiWindowFlags_ChildWindow)
        IM_ASSERT_USER_ERROR(g.WithinEndChild, "Must call EndChild() and not End()!");

    // Close anything that is open
    if (window->DC.CurrentColumns)
        EndColumns();
    PopClipRect();   // Inner window clip rectangle

    // Stop logging
    if (!(window->Flags & ImGuiWindowFlags_ChildWindow))    // FIXME: add more options for scope of logging
        LogFinish();

    // Pop from window stack
    g.CurrentWindowStack.pop_back();
    if (window->Flags & ImGuiWindowFlags_Popup)
        g.BeginPopupStack.pop_back();
    window->DC.StackSizesOnBegin.CompareWithCurrentState();
    SetCurrentWindow(g.CurrentWindowStack.empty() ? NULL : g.CurrentWindowStack.back());
}